

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O0

Status __thiscall leveldb::VersionEdit::DecodeFrom(VersionEdit *this,Slice *src)

{
  bool bVar1;
  undefined8 *in_RDX;
  pair<int,_unsigned_long> pVar2;
  pair<std::_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_>,_bool> pVar3;
  bool local_1f9;
  Slice local_1e0;
  Slice local_1d0;
  Status local_1c0;
  undefined1 local_1b1;
  pair<int,_leveldb::FileMetaData> local_1b0;
  _Base_ptr local_150;
  undefined1 local_148;
  value_type local_140;
  pair<int,_leveldb::InternalKey> local_130;
  Slice local_108 [2];
  undefined1 local_e8 [8];
  InternalKey key;
  undefined1 local_b8 [8];
  Slice str;
  FileMetaData f;
  uint64_t number;
  int level;
  uint32_t tag;
  char *msg;
  Slice input;
  Slice *src_local;
  VersionEdit *this_local;
  Status *result;
  
  Clear((VersionEdit *)src);
  msg = (char *)*in_RDX;
  input.data_ = (char *)in_RDX[1];
  _level = (char *)0x0;
  FileMetaData::FileMetaData((FileMetaData *)&str.size_);
  Slice::Slice((Slice *)local_b8);
  InternalKey::InternalKey((InternalKey *)local_e8);
  while( true ) {
    local_1f9 = false;
    if (_level == (char *)0x0) {
      local_1f9 = GetVarint32((Slice *)&msg,(uint32_t *)((long)&number + 4));
    }
    if (local_1f9 == false) break;
    switch(number._4_4_) {
    case 1:
      bVar1 = GetLengthPrefixedSlice((Slice *)&msg,(Slice *)local_b8);
      if (bVar1) {
        Slice::ToString_abi_cxx11_(local_108);
        std::__cxx11::string::operator=((string *)src,(string *)local_108);
        std::__cxx11::string::~string((string *)local_108);
        *(undefined1 *)&src[4].data_ = 1;
      }
      else {
        _level = "comparator name";
      }
      break;
    case 2:
      bVar1 = GetVarint64((Slice *)&msg,(uint64_t *)(src + 2));
      if (bVar1) {
        *(undefined1 *)((long)&src[4].data_ + 1) = 1;
      }
      else {
        _level = "log number";
      }
      break;
    case 3:
      bVar1 = GetVarint64((Slice *)&msg,(uint64_t *)(src + 3));
      if (bVar1) {
        *(undefined1 *)((long)&src[4].data_ + 3) = 1;
      }
      else {
        _level = "next file number";
      }
      break;
    case 4:
      bVar1 = GetVarint64((Slice *)&msg,&src[3].size_);
      if (bVar1) {
        *(undefined1 *)((long)&src[4].data_ + 4) = 1;
      }
      else {
        _level = "last sequence number";
      }
      break;
    case 5:
      bVar1 = GetLevel((Slice *)&msg,(int *)&number);
      if ((bVar1) && (bVar1 = GetInternalKey((Slice *)&msg,(InternalKey *)local_e8), bVar1)) {
        std::make_pair<int&,leveldb::InternalKey&>
                  (&local_130,(int *)&number,(InternalKey *)local_e8);
        std::
        vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
        ::push_back((vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                     *)&src[4].size_,&local_130);
        std::pair<int,_leveldb::InternalKey>::~pair(&local_130);
      }
      else {
        _level = "compaction pointer";
      }
      break;
    case 6:
      bVar1 = GetLevel((Slice *)&msg,(int *)&number);
      if ((bVar1) && (bVar1 = GetVarint64((Slice *)&msg,(uint64_t *)&f.largest.field_0x18), bVar1))
      {
        pVar2 = std::make_pair<int&,unsigned_long&>
                          ((int *)&number,(unsigned_long *)&f.largest.field_0x18);
        local_140.second = pVar2.second;
        local_140.first = pVar2.first;
        pVar3 = std::
                set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
                ::insert((set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
                          *)(src + 6),&local_140);
        local_150 = (_Base_ptr)pVar3.first._M_node;
        local_148 = pVar3.second;
      }
      else {
        _level = "deleted file";
      }
      break;
    case 7:
      bVar1 = GetLevel((Slice *)&msg,(int *)&number);
      if ((((bVar1) && (bVar1 = GetVarint64((Slice *)&msg,(uint64_t *)&f), bVar1)) &&
          (bVar1 = GetVarint64((Slice *)&msg,&f.number), bVar1)) &&
         ((bVar1 = GetInternalKey((Slice *)&msg,(InternalKey *)&f.file_size), bVar1 &&
          (bVar1 = GetInternalKey((Slice *)&msg,(InternalKey *)&f.smallest.field_0x18), bVar1)))) {
        std::make_pair<int&,leveldb::FileMetaData&>
                  (&local_1b0,(int *)&number,(FileMetaData *)&str.size_);
        std::
        vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
        ::push_back((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                     *)(src + 9),&local_1b0);
        std::pair<int,_leveldb::FileMetaData>::~pair(&local_1b0);
      }
      else {
        _level = "new-file entry";
      }
      break;
    default:
      _level = "unknown tag";
      break;
    case 9:
      bVar1 = GetVarint64((Slice *)&msg,&src[2].size_);
      if (bVar1) {
        *(undefined1 *)((long)&src[4].data_ + 2) = 1;
      }
      else {
        _level = "previous log number";
      }
    }
  }
  if ((_level == (char *)0x0) && (bVar1 = Slice::empty((Slice *)&msg), !bVar1)) {
    _level = "invalid tag";
  }
  local_1b1 = 0;
  Status::Status((Status *)this);
  if (_level != (char *)0x0) {
    Slice::Slice(&local_1d0,"VersionEdit");
    Slice::Slice(&local_1e0,_level);
    Status::Corruption(&local_1c0,&local_1d0,&local_1e0);
    Status::operator=((Status *)this,&local_1c0);
    Status::~Status(&local_1c0);
  }
  local_1b1 = 1;
  InternalKey::~InternalKey((InternalKey *)local_e8);
  FileMetaData::~FileMetaData((FileMetaData *)&str.size_);
  return (Status)(char *)this;
}

Assistant:

Status VersionEdit::DecodeFrom(const Slice& src) {
  Clear();
  Slice input = src;
  const char* msg = nullptr;
  uint32_t tag;

  // Temporary storage for parsing
  int level;
  uint64_t number;
  FileMetaData f;
  Slice str;
  InternalKey key;

  while (msg == nullptr && GetVarint32(&input, &tag)) {
    switch (tag) {
      case kComparator:
        if (GetLengthPrefixedSlice(&input, &str)) {
          comparator_ = str.ToString();
          has_comparator_ = true;
        } else {
          msg = "comparator name";
        }
        break;

      case kLogNumber:
        if (GetVarint64(&input, &log_number_)) {
          has_log_number_ = true;
        } else {
          msg = "log number";
        }
        break;

      case kPrevLogNumber:
        if (GetVarint64(&input, &prev_log_number_)) {
          has_prev_log_number_ = true;
        } else {
          msg = "previous log number";
        }
        break;

      case kNextFileNumber:
        if (GetVarint64(&input, &next_file_number_)) {
          has_next_file_number_ = true;
        } else {
          msg = "next file number";
        }
        break;

      case kLastSequence:
        if (GetVarint64(&input, &last_sequence_)) {
          has_last_sequence_ = true;
        } else {
          msg = "last sequence number";
        }
        break;

      case kCompactPointer:
        if (GetLevel(&input, &level) && GetInternalKey(&input, &key)) {
          compact_pointers_.push_back(std::make_pair(level, key));
        } else {
          msg = "compaction pointer";
        }
        break;

      case kDeletedFile:
        if (GetLevel(&input, &level) && GetVarint64(&input, &number)) {
          deleted_files_.insert(std::make_pair(level, number));
        } else {
          msg = "deleted file";
        }
        break;

      case kNewFile:
        if (GetLevel(&input, &level) && GetVarint64(&input, &f.number) &&
            GetVarint64(&input, &f.file_size) &&
            GetInternalKey(&input, &f.smallest) &&
            GetInternalKey(&input, &f.largest)) {
          new_files_.push_back(std::make_pair(level, f));
        } else {
          msg = "new-file entry";
        }
        break;

      default:
        msg = "unknown tag";
        break;
    }
  }

  if (msg == nullptr && !input.empty()) {
    msg = "invalid tag";
  }

  Status result;
  if (msg != nullptr) {
    result = Status::Corruption("VersionEdit", msg);
  }
  return result;
}